

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_schemas.cpp
# Opt level: O2

void duckdb::DuckDBSchemasFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  SchemaCatalogEntry *pSVar1;
  GlobalTableFunctionState *pGVar2;
  reference pvVar3;
  long lVar4;
  string *psVar5;
  idx_t val;
  _func_int **pp_Var6;
  _func_int **__n;
  _func_int **pp_Var7;
  ulong index;
  Value local_c8;
  string local_88;
  LogicalType local_68;
  string local_50;
  
  pGVar2 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar2[4]._vptr_GlobalTableFunctionState;
  pp_Var6 = pGVar2[1]._vptr_GlobalTableFunctionState;
  pp_Var7 = pGVar2[2]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)((long)pp_Var7 - (long)pp_Var6 >> 3)) {
    for (index = 0; (__n < (_func_int **)((long)pp_Var7 - (long)pp_Var6 >> 3) && (index < 0x800));
        index = index + 1) {
      pvVar3 = vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true>::get<true>
                         ((vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *)
                          (pGVar2 + 1),(size_type)__n);
      pSVar1 = pvVar3->_M_data;
      lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        ((pSVar1->super_InCatalogEntry).super_CatalogEntry.oid);
      Value::BIGINT(&local_c8,lVar4);
      DataChunk::SetValue(output,0,index,&local_c8);
      Value::~Value(&local_c8);
      psVar5 = Catalog::GetName_abi_cxx11_((pSVar1->super_InCatalogEntry).catalog);
      ::std::__cxx11::string::string((string *)&local_88,(string *)psVar5);
      Value::Value(&local_c8,&local_88);
      DataChunk::SetValue(output,1,index,&local_c8);
      Value::~Value(&local_c8);
      ::std::__cxx11::string::~string((string *)&local_88);
      val = Catalog::GetOid((pSVar1->super_InCatalogEntry).catalog);
      lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
      Value::BIGINT(&local_c8,lVar4);
      DataChunk::SetValue(output,2,index,&local_c8);
      Value::~Value(&local_c8);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)&(pSVar1->super_InCatalogEntry).super_CatalogEntry.name);
      Value::Value(&local_c8,&local_50);
      DataChunk::SetValue(output,3,index,&local_c8);
      Value::~Value(&local_c8);
      ::std::__cxx11::string::~string((string *)&local_50);
      Value::Value(&local_c8,&(pSVar1->super_InCatalogEntry).super_CatalogEntry.comment);
      DataChunk::SetValue(output,4,index,&local_c8);
      Value::~Value(&local_c8);
      Value::MAP(&local_c8,&(pSVar1->super_InCatalogEntry).super_CatalogEntry.tags);
      DataChunk::SetValue(output,5,index,&local_c8);
      Value::~Value(&local_c8);
      Value::BOOLEAN(&local_c8,(pSVar1->super_InCatalogEntry).super_CatalogEntry.internal);
      DataChunk::SetValue(output,6,index,&local_c8);
      Value::~Value(&local_c8);
      LogicalType::LogicalType(&local_68,SQLNULL);
      Value::Value(&local_c8,&local_68);
      DataChunk::SetValue(output,7,index,&local_c8);
      Value::~Value(&local_c8);
      LogicalType::~LogicalType(&local_68);
      __n = (_func_int **)((long)pGVar2[4]._vptr_GlobalTableFunctionState + 1);
      pGVar2[4]._vptr_GlobalTableFunctionState = __n;
      pp_Var6 = pGVar2[1]._vptr_GlobalTableFunctionState;
      pp_Var7 = pGVar2[2]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void DuckDBSchemasFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBSchemasData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset].get();

		// return values:
		idx_t col = 0;
		// "oid", PhysicalType::BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(entry.oid)));
		// database_name, VARCHAR
		output.SetValue(col++, count, entry.catalog.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(entry.catalog.GetOid())));
		// "schema_name", PhysicalType::VARCHAR
		output.SetValue(col++, count, Value(entry.name));
		// "comment", PhysicalType::VARCHAR
		output.SetValue(col++, count, Value(entry.comment));
		// "tags", MAP(VARCHAR, VARCHAR)
		output.SetValue(col++, count, Value::MAP(entry.tags));
		// "internal", PhysicalType::BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(entry.internal));
		// "sql", PhysicalType::VARCHAR
		output.SetValue(col++, count, Value());

		data.offset++;
		count++;
	}
	output.SetCardinality(count);
}